

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subbreak3.cpp
# Opt level: O2

bool Cipher::beamSearch(TParameters *params,TFreqMap *freqMap,TResult *result)

{
  TClusters *clusters;
  vector<int,_std::allocator<int>_> *this;
  vector<float,_std::allocator<float>_> *this_00;
  int *piVar1;
  _Rb_tree_header *__return_storage_ptr__;
  uint uVar2;
  mapped_type mVar3;
  pointer piVar4;
  pointer piVar5;
  pointer piVar6;
  pointer pfVar7;
  pointer ppVar8;
  pointer pTVar9;
  pointer pTVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  int iVar13;
  mapped_type *pmVar14;
  mapped_type *this_01;
  _Base_ptr p_Var15;
  ulong uVar16;
  TClusterToLetterMap *__x;
  ulong uVar17;
  uint uVar18;
  ulong uVar19;
  ulong uVar20;
  int i;
  long lVar21;
  pointer ppVar22;
  TClusterToLetterMap *this_02;
  long lVar23;
  int iVar24;
  __normal_iterator<std::pair<int,_std::vector<int,_std::allocator<int>_>_>_*,_std::vector<std::pair<int,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<int,_std::vector<int,_std::allocator<int>_>_>_>_>_>
  __i;
  pointer ppVar25;
  int a;
  long lVar26;
  pointer pTVar27;
  float fVar28;
  TProb TVar29;
  int local_1c0;
  vector<std::pair<int,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<int,_std::vector<int,_std::allocator<int>_>_>_>_>
  sorted;
  vector<THypothesis,_std::allocator<THypothesis>_> hypothesesNew;
  undefined1 local_f8 [8];
  _Vector_base<int,_std::allocator<int>_> local_f0;
  vector<THypothesis,_std::allocator<THypothesis>_> hypothesesCur;
  map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
  counts;
  vector<int,_std::allocator<int>_> local_68;
  pointer local_50;
  pointer pfStack_48;
  pointer local_40;
  
  piVar4 = (result->clusters).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  piVar5 = (result->clusters).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar2 = params->nHypothesesToKeep;
  hypothesesCur.super__Vector_base<THypothesis,_std::allocator<THypothesis>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  hypothesesCur.super__Vector_base<THypothesis,_std::allocator<THypothesis>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  hypothesesCur.super__Vector_base<THypothesis,_std::allocator<THypothesis>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  hypothesesNew.super__Vector_base<THypothesis,_std::allocator<THypothesis>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  hypothesesNew.super__Vector_base<THypothesis,_std::allocator<THypothesis>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  hypothesesNew.super__Vector_base<THypothesis,_std::allocator<THypothesis>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<THypothesis,_std::allocator<THypothesis>_>::resize(&hypothesesCur,(long)(int)uVar2);
  std::vector<THypothesis,_std::allocator<THypothesis>_>::resize
            (&hypothesesNew,(long)(int)uVar2 * 0x1b);
  pTVar9 = hypothesesCur.super__Vector_base<THypothesis,_std::allocator<THypothesis>_>._M_impl.
           super__Vector_impl_data._M_start;
  clusters = &result->clusters;
  __return_storage_ptr__ = &counts._M_t._M_impl.super__Rb_tree_header;
  counts._M_t._M_impl._0_8_ = (ulong)(uint)counts._M_t._M_impl._4_4_ << 0x20;
  getNullCLMap((TClusterToLetterMap *)__return_storage_ptr__,clusters);
  local_f8 = (undefined1  [8])((ulong)(uint)local_f8._4_4_ << 0x20);
  std::vector<int,_std::allocator<int>_>::vector
            (&local_68,0x1c,(value_type_conflict3 *)local_f8,(allocator_type *)&sorted);
  local_50 = (pointer)0x0;
  pfStack_48 = (pointer)0x0;
  local_40 = (pointer)0x0;
  beamSearch::THypothesis::operator=(pTVar9,(THypothesis *)&counts);
  beamSearch::THypothesis::~THypothesis((THypothesis *)&counts);
  lVar26 = 0;
  for (lVar21 = 0;
      piVar6 = (params->hint).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start,
      lVar21 < (int)((ulong)((long)(params->hint).super__Vector_base<int,_std::allocator<int>_>.
                                   _M_impl.super__Vector_impl_data._M_finish - (long)piVar6) >> 2);
      lVar21 = lVar21 + 1) {
    if (*(int *)((long)piVar6 + lVar26) != -1) {
      fVar28 = frand();
      if (0.5 < fVar28) {
        mVar3 = *(mapped_type *)
                 ((long)(params->hint).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start + lVar26);
        pmVar14 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                  operator[](&pTVar9->clMap,
                             (key_type_conflict *)
                             ((long)(clusters->super__Vector_base<int,_std::allocator<int>_>).
                                    _M_impl.super__Vector_impl_data._M_start + lVar26));
        *pmVar14 = mVar3;
      }
    }
    lVar26 = lVar26 + 4;
  }
  translate(&pTVar9->clMap,clusters,&pTVar9->plain);
  local_1c0 = (int)((ulong)((long)piVar4 - (long)piVar5) >> 2);
  counts._M_t._M_impl._0_4_ = 0x3f800000;
  std::vector<float,_std::allocator<float>_>::resize
            (&pTVar9->memo,(long)local_1c0,(value_type_conflict1 *)&counts);
  TVar29 = calcScore(params,freqMap,&pTVar9->plain,&pTVar9->memo);
  pTVar9->p = TVar29;
  sorted.
  super__Vector_base<std::pair<int,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<int,_std::vector<int,_std::allocator<int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  counts._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       (ulong)(uint)counts._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ << 0x20;
  counts._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  counts._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  sorted.
  super__Vector_base<std::pair<int,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<int,_std::vector<int,_std::allocator<int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  sorted.
  super__Vector_base<std::pair<int,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<int,_std::vector<int,_std::allocator<int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  iVar13 = 0;
  counts._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &__return_storage_ptr__->_M_header;
  counts._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &__return_storage_ptr__->_M_header;
  while( true ) {
    local_f8._0_4_ = iVar13;
    piVar4 = (result->clusters).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((int)((ulong)((long)(result->clusters).super__Vector_base<int,_std::allocator<int>_>._M_impl
                            .super__Vector_impl_data._M_finish - (long)piVar4) >> 2) <= iVar13)
    break;
    this_01 = std::
              map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
              ::operator[](&counts,piVar4 + iVar13);
    std::vector<int,_std::allocator<int>_>::push_back(this_01,(value_type_conflict3 *)local_f8);
    iVar13 = local_f8._0_4_ + 1;
  }
  for (p_Var15 = counts._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      ppVar8 = sorted.
               super__Vector_base<std::pair<int,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<int,_std::vector<int,_std::allocator<int>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish,
      ppVar22 = sorted.
                super__Vector_base<std::pair<int,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<int,_std::vector<int,_std::allocator<int>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start,
      (_Rb_tree_header *)p_Var15 != __return_storage_ptr__;
      p_Var15 = (_Base_ptr)std::_Rb_tree_increment(p_Var15)) {
    std::pair<int,_std::vector<int,_std::allocator<int>_>_>::
    pair<std::vector<int,_std::allocator<int>_>_&,_true>
              ((pair<int,_std::vector<int,_std::allocator<int>_>_> *)local_f8,(int *)(p_Var15 + 1),
               (vector<int,_std::allocator<int>_> *)&p_Var15[1]._M_parent);
    std::
    vector<std::pair<int,std::vector<int,std::allocator<int>>>,std::allocator<std::pair<int,std::vector<int,std::allocator<int>>>>>
    ::emplace_back<std::pair<int,std::vector<int,std::allocator<int>>>>
              ((vector<std::pair<int,std::vector<int,std::allocator<int>>>,std::allocator<std::pair<int,std::vector<int,std::allocator<int>>>>>
                *)&sorted,(pair<int,_std::vector<int,_std::allocator<int>_>_> *)local_f8);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_f0);
  }
  if (sorted.
      super__Vector_base<std::pair<int,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<int,_std::vector<int,_std::allocator<int>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      sorted.
      super__Vector_base<std::pair<int,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<int,_std::vector<int,_std::allocator<int>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    lVar26 = (long)sorted.
                   super__Vector_base<std::pair<int,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<int,_std::vector<int,_std::allocator<int>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)sorted.
                   super__Vector_base<std::pair<int,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<int,_std::vector<int,_std::allocator<int>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
    uVar16 = lVar26 >> 5;
    lVar21 = 0x3f;
    if (uVar16 != 0) {
      for (; uVar16 >> lVar21 == 0; lVar21 = lVar21 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<std::pair<int,std::vector<int,std::allocator<int>>>*,std::vector<std::pair<int,std::vector<int,std::allocator<int>>>,std::allocator<std::pair<int,std::vector<int,std::allocator<int>>>>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<Cipher::beamSearch(Cipher::TParameters_const&,Cipher::TFreqMap_const&,Cipher::TResult&)::__0>>
              (sorted.
               super__Vector_base<std::pair<int,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<int,_std::vector<int,_std::allocator<int>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
               sorted.
               super__Vector_base<std::pair<int,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<int,_std::vector<int,_std::allocator<int>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish,((uint)lVar21 ^ 0x3f) * 2 ^ 0x7e);
    if (lVar26 < 0x201) {
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<std::pair<int,std::vector<int,std::allocator<int>>>*,std::vector<std::pair<int,std::vector<int,std::allocator<int>>>,std::allocator<std::pair<int,std::vector<int,std::allocator<int>>>>>>,__gnu_cxx::__ops::_Iter_comp_iter<Cipher::beamSearch(Cipher::TParameters_const&,Cipher::TFreqMap_const&,Cipher::TResult&)::__0>>
                (ppVar22,ppVar8);
    }
    else {
      ppVar25 = ppVar22 + 0x10;
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<std::pair<int,std::vector<int,std::allocator<int>>>*,std::vector<std::pair<int,std::vector<int,std::allocator<int>>>,std::allocator<std::pair<int,std::vector<int,std::allocator<int>>>>>>,__gnu_cxx::__ops::_Iter_comp_iter<Cipher::beamSearch(Cipher::TParameters_const&,Cipher::TFreqMap_const&,Cipher::TResult&)::__0>>
                (ppVar22,ppVar25);
      for (; ppVar25 != ppVar8; ppVar25 = ppVar25 + 1) {
        std::
        __unguarded_linear_insert<__gnu_cxx::__normal_iterator<std::pair<int,std::vector<int,std::allocator<int>>>*,std::vector<std::pair<int,std::vector<int,std::allocator<int>>>,std::allocator<std::pair<int,std::vector<int,std::allocator<int>>>>>>,__gnu_cxx::__ops::_Val_comp_iter<Cipher::beamSearch(Cipher::TParameters_const&,Cipher::TFreqMap_const&,Cipher::TResult&)::__0>>
                  (ppVar25);
      }
    }
  }
  std::
  _Rb_tree<int,_std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
  ::~_Rb_tree(&counts._M_t);
  pTVar10 = hypothesesCur.super__Vector_base<THypothesis,_std::allocator<THypothesis>_>._M_impl.
            super__Vector_impl_data._M_start;
  pTVar9 = hypothesesNew.super__Vector_base<THypothesis,_std::allocator<THypothesis>_>._M_impl.
           super__Vector_impl_data._M_start;
  __x = &(hypothesesCur.super__Vector_base<THypothesis,_std::allocator<THypothesis>_>._M_impl.
          super__Vector_impl_data._M_start)->clMap;
  uVar18 = 1;
  lVar21 = 0;
  while ((lVar21 < (int)((ulong)((long)sorted.
                                       super__Vector_base<std::pair<int,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<int,_std::vector<int,_std::allocator<int>_>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                (long)sorted.
                                      super__Vector_base<std::pair<int,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<int,_std::vector<int,_std::allocator<int>_>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start) >> 5) &&
         (sorted.
          super__Vector_base<std::pair<int,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<int,_std::vector<int,_std::allocator<int>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start[lVar21].second.
          super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start !=
          sorted.
          super__Vector_base<std::pair<int,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<int,_std::vector<int,_std::allocator<int>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start[lVar21].second.
          super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish)))
  {
    ppVar22 = sorted.
              super__Vector_base<std::pair<int,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<int,_std::vector<int,_std::allocator<int>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start + lVar21;
    pmVar14 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::at
                        (__x,&ppVar22->first);
    if (*pmVar14 == 0) {
      uVar17 = 0;
      uVar16 = (ulong)uVar18;
      if ((int)uVar18 < 1) {
        uVar16 = uVar17;
      }
      uVar18 = 0;
      for (; uVar17 != uVar16; uVar17 = uVar17 + 1) {
        for (lVar26 = 1; lVar26 != 0x1c; lVar26 = lVar26 + 1) {
          if (pTVar10[uVar17].nused.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[lVar26] < 0x15) {
            this_02 = &pTVar9[(int)uVar18].clMap;
            pTVar9[(int)uVar18].p = pTVar10[uVar17].p;
            std::
            _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
            ::operator=(&this_02->_M_t,&pTVar10[uVar17].clMap._M_t);
            pTVar27 = pTVar9 + (int)uVar18;
            this = &pTVar27->plain;
            std::vector<int,_std::allocator<int>_>::operator=(this,&pTVar10[uVar17].plain);
            std::vector<int,_std::allocator<int>_>::operator=
                      (&pTVar27->nused,&pTVar10[uVar17].nused);
            this_00 = &pTVar27->memo;
            std::vector<float,_std::allocator<float>_>::operator=(this_00,&pTVar10[uVar17].memo);
            uVar18 = uVar18 + 1;
            piVar1 = (pTVar27->nused).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start + lVar26;
            *piVar1 = *piVar1 + 1;
            piVar4 = (ppVar22->second).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start;
            uVar19 = (ulong)((long)(ppVar22->second).super__Vector_base<int,_std::allocator<int>_>.
                                   _M_impl.super__Vector_impl_data._M_finish - (long)piVar4) >> 2;
            uVar20 = uVar19 & 0xffffffff;
            if ((int)uVar19 < 1) {
              uVar20 = 0;
            }
            for (uVar19 = 0; uVar19 != uVar20; uVar19 = uVar19 + 1) {
              iVar13 = piVar4[uVar19];
              (this->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
              _M_start[iVar13] = (mapped_type)lVar26;
              iVar24 = iVar13 + freqMap->len + -1;
              iVar13 = iVar13 - freqMap->len;
              if (iVar13 < 0) {
                iVar13 = -1;
              }
              if (local_1c0 + -1 <= iVar24) {
                iVar24 = local_1c0 + -1;
              }
              pfVar7 = (this_00->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                       super__Vector_impl_data._M_start;
              for (lVar23 = (long)iVar13 << 2; (long)iVar24 * 4 != lVar23; lVar23 = lVar23 + 4) {
                *(undefined4 *)((long)pfVar7 + lVar23 + 4) = 0x3f800000;
              }
            }
            pmVar14 = std::
                      map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                      operator[](this_02,&ppVar22->first);
            *pmVar14 = (mapped_type)lVar26;
            TVar29 = calcScore(params,freqMap,this,this_00);
            pTVar27->p = TVar29;
          }
        }
      }
      counts._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      counts._M_t._M_impl._0_8_ = 0;
      counts._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      counts._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
      uVar16 = 0;
      if (0 < (int)uVar18) {
        uVar16 = (ulong)uVar18;
      }
      pTVar27 = pTVar9;
      for (uVar17 = 0; uVar12 = counts._M_t._M_impl.super__Rb_tree_header._M_header._0_8_,
          uVar11 = counts._M_t._M_impl._0_8_, uVar16 != uVar17; uVar17 = uVar17 + 1) {
        local_f8 = (undefined1  [8])(((ulong)(uint)pTVar27->p << 0x20) + uVar17);
        std::vector<std::pair<int,float>,std::allocator<std::pair<int,float>>>::
        emplace_back<std::pair<int,float>>
                  ((vector<std::pair<int,float>,std::allocator<std::pair<int,float>>> *)&counts,
                   (pair<int,_float> *)local_f8);
        pTVar27 = pTVar27 + 1;
      }
      if (counts._M_t._M_impl._0_8_ != counts._M_t._M_impl.super__Rb_tree_header._M_header._0_8_) {
        lVar23 = counts._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ -
                 counts._M_t._M_impl._0_8_;
        uVar16 = lVar23 >> 3;
        lVar26 = 0x3f;
        if (uVar16 != 0) {
          for (; uVar16 >> lVar26 == 0; lVar26 = lVar26 + -1) {
          }
        }
        std::
        __introsort_loop<__gnu_cxx::__normal_iterator<std::pair<int,float>*,std::vector<std::pair<int,float>,std::allocator<std::pair<int,float>>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<Cipher::beamSearch(Cipher::TParameters_const&,Cipher::TFreqMap_const&,Cipher::TResult&)::__1>>
                  (counts._M_t._M_impl._0_8_,
                   counts._M_t._M_impl.super__Rb_tree_header._M_header._0_8_,
                   ((uint)lVar26 ^ 0x3f) * 2 ^ 0x7e);
        if (lVar23 < 0x81) {
          std::
          __insertion_sort<__gnu_cxx::__normal_iterator<std::pair<int,float>*,std::vector<std::pair<int,float>,std::allocator<std::pair<int,float>>>>,__gnu_cxx::__ops::_Iter_comp_iter<Cipher::beamSearch(Cipher::TParameters_const&,Cipher::TFreqMap_const&,Cipher::TResult&)::__1>>
                    (uVar11,uVar12);
        }
        else {
          lVar26 = uVar11 + 0x80;
          std::
          __insertion_sort<__gnu_cxx::__normal_iterator<std::pair<int,float>*,std::vector<std::pair<int,float>,std::allocator<std::pair<int,float>>>>,__gnu_cxx::__ops::_Iter_comp_iter<Cipher::beamSearch(Cipher::TParameters_const&,Cipher::TFreqMap_const&,Cipher::TResult&)::__1>>
                    (uVar11,lVar26);
          for (; lVar26 != uVar12; lVar26 = lVar26 + 8) {
            std::
            __unguarded_linear_insert<__gnu_cxx::__normal_iterator<std::pair<int,float>*,std::vector<std::pair<int,float>,std::allocator<std::pair<int,float>>>>,__gnu_cxx::__ops::_Val_comp_iter<Cipher::beamSearch(Cipher::TParameters_const&,Cipher::TFreqMap_const&,Cipher::TResult&)::__1>>
                      (lVar26);
          }
        }
      }
      if ((int)uVar2 <= (int)uVar18) {
        uVar18 = uVar2;
      }
      uVar16 = 0;
      if (0 < (int)uVar18) {
        uVar16 = (ulong)uVar18;
      }
      pTVar27 = pTVar10;
      for (uVar17 = 0; uVar16 != uVar17; uVar17 = uVar17 + 1) {
        beamSearch::THypothesis::operator=
                  (pTVar27,pTVar9 + *(int *)(counts._M_t._M_impl._0_8_ + uVar17 * 8));
        pTVar27 = pTVar27 + 1;
      }
      std::_Vector_base<std::pair<int,_float>,_std::allocator<std::pair<int,_float>_>_>::
      ~_Vector_base((_Vector_base<std::pair<int,_float>,_std::allocator<std::pair<int,_float>_>_> *)
                    &counts);
    }
    lVar21 = lVar21 + 1;
  }
  std::
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  ::operator=(&(result->clMap)._M_t,&__x->_M_t);
  result->p = pTVar10->p;
  std::
  vector<std::pair<int,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<int,_std::vector<int,_std::allocator<int>_>_>_>_>
  ::~vector(&sorted);
  std::vector<THypothesis,_std::allocator<THypothesis>_>::~vector(&hypothesesNew);
  std::vector<THypothesis,_std::allocator<THypothesis>_>::~vector(&hypothesesCur);
  return true;
}

Assistant:

bool beamSearch(
        const TParameters & params,
        const TFreqMap & freqMap,
        TResult & result) {
        const auto & clusters = result.clusters;

        struct THypothesis {
            TProb p;
            TClusterToLetterMap clMap;
            std::vector<TLetter> plain;
            std::vector<int> nused;
            std::vector<TProb> memo;
        };

        const int N = clusters.size();
        const int nSymbols = 27;
        const int nHypothesesToKeep = params.nHypothesesToKeep;

        int nCur = 0;
        std::vector<THypothesis> hypothesesCur;
        std::vector<THypothesis> hypothesesNew;
        hypothesesCur.resize(nHypothesesToKeep);
        hypothesesNew.resize(nHypothesesToKeep*nSymbols);

        {
            auto & hcur = hypothesesCur[0];
            hcur = { 0.0, getNullCLMap(clusters), {}, std::vector<int>(nSymbols + 1, 0), {}};
            for (int i = 0; i < (int) params.hint.size(); ++i) {
                if (params.hint[i] != -1) {
                    if (frand() > 0.5) {
                        hcur.clMap[clusters[i]] = params.hint[i];
                    }
                }
            }
            translate(hcur.clMap, clusters, hcur.plain);
            hcur.memo.resize(N, 1.0);
            hcur.p = calcScore(params, freqMap, hcur.plain, hcur.memo);
            ++nCur;
        }

        // sorted clusters by frequency
        std::vector<std::pair<TClusterId, std::vector<int>>> sorted;

        {
            std::map<TClusterId, std::vector<int>> counts;
            for (int i = 0; i < (int) clusters.size(); ++i) {
                counts[clusters[i]].push_back(i);
            }

            for (auto & kv : counts) {
                sorted.push_back(std::make_pair(kv.first, kv.second));
            }
            std::sort(sorted.begin(), sorted.end(), [](const auto & a, const auto & b) {
                return a.second.size() > b.second.size();
            });
        }

        for (int i = 0; i < (int) sorted.size(); ++i) {
            auto & kvSorted = sorted[i];
            if (kvSorted.second.empty()) break;

            //printf("Processing cluster %2d ('%c') - count = %d\n", kvSorted.first, getEncodedChar(kvSorted.first), (int) kvSorted.second.size());

            if (hypothesesCur[0].clMap.at(kvSorted.first) != 0) {
                continue;
            }

            int nNew = 0;
            for (int j = 0; j < nCur; ++j) {
                const auto & hcur = hypothesesCur[j];

                for (int a = 1; a <= nSymbols; ++a) {
                    // TODO: maybe become parameter
                    // how many clusters can map to the same symbol
                    if (hcur.nused[a] > 20) continue;

                    auto & hnew = hypothesesNew[nNew++];

                    hnew = hcur;
                    hnew.nused[a]++;
                    for (int k = 0; k < (int) kvSorted.second.size(); ++k) {
                        const auto idx = kvSorted.second[k];
                        hnew.plain[idx] = a;

                        const auto idx0 = std::max(0, idx - freqMap.len + 1);
                        const auto idx1 = std::min(N - 1, idx + freqMap.len - 1);
                        std::fill(hnew.memo.begin() + idx0, hnew.memo.begin() + idx1 + 1, 1.0);
                    }
                    hnew.clMap[kvSorted.first] = a;
                    hnew.p = calcScore(params, freqMap, hnew.plain, hnew.memo);
                }
            }

            // sort hypothesesNew by p
            {
                std::vector<std::pair<int, TProb>> sortedNew;
                for (int j = 0; j < nNew; ++j) {
                    sortedNew.push_back(std::make_pair(j, hypothesesNew[j].p));
                }
                std::sort(sortedNew.begin(), sortedNew.end(), [](const auto & a, const auto & b) {
                    return a.second > b.second;
                });

                //printf("Top p = %g\n", (double) hypothesesNew[sortedNew[0].first].p);
                //printDecoded(clusters, hypothesesNew[sortedNew[0].first].clMap);

                nCur = std::min(nHypothesesToKeep, nNew);
                for (int j = 0; j < nCur; ++j) {
                    hypothesesCur[j] = std::move(hypothesesNew[sortedNew[j].first]);
                }
            }
        }

        result.clMap = hypothesesCur[0].clMap;
        result.p = hypothesesCur[0].p;

        return true;
    }